

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O1

ArenaAllocator * __thiscall
duckdb::GlobalUngroupedAggregateState::CreateAllocator(GlobalUngroupedAggregateState *this)

{
  Allocator *allocator;
  _Head_base<0UL,_duckdb::ArenaAllocator_*,_false> _Var1;
  int iVar2;
  ArenaAllocator *this_00;
  reference this_01;
  type pAVar3;
  _Head_base<0UL,_duckdb::ArenaAllocator_*,_false> local_20;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    allocator = this->client_allocator;
    this_00 = (ArenaAllocator *)operator_new(0x48);
    ArenaAllocator::ArenaAllocator(this_00,allocator,0x800);
    local_20._M_head_impl = this_00;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
                *)&this->stored_allocators,
               (unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                *)&local_20);
    _Var1._M_head_impl = local_20._M_head_impl;
    if (local_20._M_head_impl != (ArenaAllocator *)0x0) {
      ArenaAllocator::~ArenaAllocator(local_20._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_true>
              ::back(&this->stored_allocators);
    pAVar3 = unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
             operator*(this_01);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return pAVar3;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

ArenaAllocator &GlobalUngroupedAggregateState::CreateAllocator() const {
	lock_guard<mutex> glock(lock);
	stored_allocators.emplace_back(make_uniq<ArenaAllocator>(client_allocator));
	return *stored_allocators.back();
}